

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# alex_base.h
# Opt level: O0

double __thiscall alex::ExpectedShiftsAccumulator::get_stat(ExpectedShiftsAccumulator *this)

{
  long lVar1;
  longlong cur_num_expected_shifts;
  longlong dense_region_length;
  ExpectedShiftsAccumulator *this_local;
  double local_8;
  
  if (this->count_ == 0) {
    local_8 = 0.0;
  }
  else {
    lVar1 = (long)((this->last_position_ - this->dense_region_start_idx_) + 1);
    local_8 = (double)(this->num_expected_shifts_ + (lVar1 * lVar1) / 4) / (double)this->count_;
  }
  return local_8;
}

Assistant:

double get_stat() override {
    if (count_ == 0) return 0;
    // first need to accumulate statistics for current packed region
    long long dense_region_length = last_position_ - dense_region_start_idx_ + 1;
    long long cur_num_expected_shifts =
        num_expected_shifts_ + (dense_region_length * dense_region_length) / 4;
    return cur_num_expected_shifts / static_cast<double>(count_);
  }